

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Solver::ccMinimize
          (Solver *this,LitVec *cc,LitVec *removed,uint32 antes,CCMinRecursive *ccMin)

{
  bool bVar1;
  size_type sVar2;
  uint32 uVar3;
  reference pLVar4;
  iterator pLVar5;
  reference __b;
  int in_ECX;
  iterator in_RDX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  CCMinRecursive *in_RDI;
  long in_R8;
  uint32 unaff_retaddr;
  Solver *in_stack_00000008;
  Literal in_stack_00000010;
  size_type i;
  uint32 varLevel;
  uint32 onAssert;
  uint32 assertPos;
  uint32 assertLevel;
  size_type j;
  undefined4 in_stack_ffffffffffffff78;
  Var in_stack_ffffffffffffff7c;
  Solver *in_stack_ffffffffffffff80;
  Literal *in_stack_ffffffffffffff88;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffffa0;
  byte local_55;
  size_type local_40;
  uint32 local_38;
  size_type local_34;
  uint local_30;
  uint local_2c;
  
  if (in_R8 != 0) {
    ccMinRecurseInit(in_stack_ffffffffffffff80,
                     (CCMinRecursive *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                    );
  }
  local_2c = 1;
  local_30 = 0;
  local_34 = 1;
  local_38 = 0;
  local_40 = 1;
  while( true ) {
    sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RSI);
    if (local_40 == sVar2) break;
    local_55 = 1;
    if (in_ECX != 3) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                (in_RSI,local_40);
      Literal::operator~((Literal *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      bVar1 = ccRemovable(in_stack_00000008,in_stack_00000010,unaff_retaddr,in_RDI);
      local_55 = bVar1 ^ 0xff;
    }
    if ((local_55 & 1) == 0) {
      in_stack_ffffffffffffff98 = in_RDX;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                (in_RSI,local_40);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (in_RSI,local_40);
      Literal::var(pLVar4);
      uVar3 = level(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      if (local_30 < uVar3) {
        local_34 = local_2c;
        local_38 = 0;
        local_30 = uVar3;
      }
      local_38 = (uVar3 == local_30) + local_38;
      in_stack_ffffffffffffffa0 =
           (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (in_RSI,local_40);
      pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (in_RSI,local_2c);
      pLVar4->rep_ = *(uint32 *)&(in_stack_ffffffffffffffa0->ebo_).buf;
      local_2c = local_2c + 1;
    }
    local_40 = local_40 + 1;
  }
  pLVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(in_RSI);
  pLVar5 = pLVar5 + local_2c;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(in_RSI);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,pLVar5);
  if (local_34 != 1) {
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (in_RSI,1);
    __b = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                    (in_RSI,local_34);
    std::swap<Clasp::Literal>(pLVar4,__b);
  }
  return local_38;
}

Assistant:

uint32 Solver::ccMinimize(LitVec& cc, LitVec& removed, uint32 antes, CCMinRecursive* ccMin) {
	if (ccMin) { ccMinRecurseInit(*ccMin); }
	// skip the asserting literal
	LitVec::size_type j = 1;
	uint32 assertLevel  = 0;
	uint32 assertPos    = 1;
	uint32 onAssert     = 0;
	uint32 varLevel     = 0;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		if (antes == SolverStrategies::no_antes || !ccRemovable(~cc[i], antes, ccMin)) {
			if ( (varLevel = level(cc[i].var())) > assertLevel ) {
				assertLevel = varLevel;
				assertPos   = static_cast<uint32>(j);
				onAssert    = 0;
			}
			onAssert += (varLevel == assertLevel);
			cc[j++] = cc[i];
		}
		else {
			removed.push_back(cc[i]);
		}
	}
	cc.erase(cc.begin()+j, cc.end());
	if (assertPos != 1) {
		std::swap(cc[1], cc[assertPos]);
	}
	return onAssert;
}